

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O1

void __thiscall
CMU462::StaticScene::AreaLight::AreaLight
          (AreaLight *this,Spectrum *rad,Vector3D *pos,Vector3D *dir,Vector3D *dim_x,Vector3D *dim_y
          )

{
  float fVar1;
  double dVar2;
  double dVar3;
  
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_sample_L_00266be0;
  fVar1 = rad->g;
  (this->radiance).r = rad->r;
  (this->radiance).g = fVar1;
  (this->radiance).b = rad->b;
  (this->position).x = pos->x;
  (this->position).y = pos->y;
  (this->position).z = pos->z;
  (this->direction).x = dir->x;
  (this->direction).y = dir->y;
  (this->direction).z = dir->z;
  (this->dim_x).x = dim_x->x;
  (this->dim_x).y = dim_x->y;
  (this->dim_x).z = dim_x->z;
  (this->dim_y).x = dim_y->x;
  (this->dim_y).y = dim_y->y;
  (this->dim_y).z = dim_y->z;
  (this->sampler).super_Sampler2D._vptr_Sampler2D = (_func_int **)&PTR__Sampler2D_00267120;
  dVar2 = dim_x->z * dim_x->z + dim_x->x * dim_x->x + dim_x->y * dim_x->y;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar3 = dim_y->z * dim_y->z + dim_y->x * dim_y->x + dim_y->y * dim_y->y;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  this->area = (float)(dVar2 * dVar3);
  return;
}

Assistant:

AreaLight::AreaLight(const Spectrum& rad, 
                     const Vector3D& pos,   const Vector3D& dir, 
                     const Vector3D& dim_x, const Vector3D& dim_y)
  : radiance(rad), position(pos), direction(dir),
    dim_x(dim_x), dim_y(dim_y), area(dim_x.norm() * dim_y.norm()) { }